

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::Dynamic_Proxy_Function::operator==
          (Dynamic_Proxy_Function *this,Proxy_Function_Base *rhs)

{
  bool bVar1;
  Param_Types *pPVar2;
  long in_RSI;
  long in_RDI;
  Dynamic_Proxy_Function *prhs;
  uint6 in_stack_ffffffffffffffc8;
  bool bVar3;
  undefined1 uVar4;
  Param_Types *this_00;
  
  if (in_RSI == 0) {
    pPVar2 = (Param_Types *)0x0;
  }
  else {
    pPVar2 = (Param_Types *)__dynamic_cast(in_RSI,&Proxy_Function_Base::typeinfo,&typeinfo,0);
  }
  uVar4 = true;
  bVar3 = (bool)uVar4;
  if (((in_RDI != in_RSI) && (bVar3 = false, pPVar2 != (Param_Types *)0x0)) &&
     (bVar3 = false, *(int *)(in_RDI + 0x20) == *(int *)&(pPVar2->m_doti).m_type_info)) {
    this_00 = pPVar2;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x60));
    bVar3 = false;
    if (!bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)&pPVar2[1].m_doti.m_bare_type_info);
      bVar3 = false;
      if (!bVar1) {
        bVar3 = Param_Types::operator==
                          (this_00,(Param_Types *)CONCAT17(uVar4,(uint7)in_stack_ffffffffffffffc8));
      }
    }
  }
  return bVar3;
}

Assistant:

virtual bool operator==(const Proxy_Function_Base &rhs) const CHAISCRIPT_OVERRIDE
        {
          const Dynamic_Proxy_Function *prhs = dynamic_cast<const Dynamic_Proxy_Function *>(&rhs);

          return this == &rhs
            || (prhs
                && this->m_arity == prhs->m_arity
                && !this->m_guard && !prhs->m_guard
                && this->m_param_types == prhs->m_param_types);
        }